

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haptic.c
# Opt level: O0

_Bool al_rumble_haptic(ALLEGRO_HAPTIC *hap,double intensity,double duration,
                      ALLEGRO_HAPTIC_EFFECT_ID *id)

{
  _Bool _Var1;
  ALLEGRO_HAPTIC_EFFECT effect;
  undefined4 in_stack_ffffffffffffff5c;
  ALLEGRO_HAPTIC_EFFECT *in_stack_ffffffffffffff60;
  ALLEGRO_HAPTIC *in_stack_ffffffffffffff68;
  
  _Var1 = al_upload_and_play_haptic_effect
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     (ALLEGRO_HAPTIC_EFFECT_ID *)CONCAT44(in_stack_ffffffffffffff5c,1),0);
  return _Var1;
}

Assistant:

bool al_rumble_haptic(ALLEGRO_HAPTIC *hap,
   double intensity, double duration, ALLEGRO_HAPTIC_EFFECT_ID *id)
{
   ALLEGRO_HAPTIC_EFFECT effect;
   ASSERT(hap);
   ASSERT(id);

   effect.type = ALLEGRO_HAPTIC_RUMBLE;
   effect.data.rumble.strong_magnitude = intensity;
   effect.data.rumble.weak_magnitude = intensity;
   effect.replay.delay = 0.0;
   effect.replay.length = duration;
   return al_upload_and_play_haptic_effect(hap, &effect, id, 1);
}